

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::KNearestNeighborsClassifier::clear_DefaultClassLabel
          (KNearestNeighborsClassifier *this)

{
  DefaultClassLabelCase DVar1;
  string *default_value;
  KNearestNeighborsClassifier *this_local;
  
  DVar1 = DefaultClassLabel_case(this);
  if ((DVar1 != DEFAULTCLASSLABEL_NOT_SET) && (DVar1 == kDefaultStringLabel)) {
    default_value = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::DestroyNoArena
              (&(this->DefaultClassLabel_).defaultstringlabel_,default_value);
  }
  this->_oneof_case_[1] = 0;
  return;
}

Assistant:

void KNearestNeighborsClassifier::clear_DefaultClassLabel() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.KNearestNeighborsClassifier)
  switch (DefaultClassLabel_case()) {
    case kDefaultStringLabel: {
      DefaultClassLabel_.defaultstringlabel_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
      break;
    }
    case kDefaultInt64Label: {
      // No need to clear
      break;
    }
    case DEFAULTCLASSLABEL_NOT_SET: {
      break;
    }
  }
  _oneof_case_[1] = DEFAULTCLASSLABEL_NOT_SET;
}